

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptbuilder.cpp
# Opt level: O0

void __thiscall
ScriptBuilder_StringBuildTest_Test::TestBody(ScriptBuilder_StringBuildTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  AssertHelper local_8b0;
  Message local_8a8;
  string local_8a0;
  undefined1 local_880 [8];
  AssertionResult gtest_ar_7;
  Message local_868;
  string local_860;
  undefined1 local_840 [8];
  AssertionResult gtest_ar_6;
  Message local_828;
  Script local_820;
  allocator local_7e1;
  string local_7e0;
  allocator local_7b9;
  string local_7b8;
  allocator local_791;
  string local_790;
  allocator local_769;
  string local_768;
  ScriptBuilder local_748;
  AssertHelper local_728;
  Message local_720;
  string local_718;
  undefined1 local_6f8 [8];
  AssertionResult gtest_ar_5;
  Message local_6e0;
  string local_6d8;
  undefined1 local_6b8 [8];
  AssertionResult gtest_ar_4;
  Message local_6a0;
  Script local_698;
  allocator local_659;
  string local_658;
  allocator local_631;
  string local_630;
  allocator local_609;
  string local_608;
  allocator local_5e1;
  string local_5e0;
  allocator local_5b9;
  string local_5b8;
  allocator local_591;
  string local_590;
  allocator local_569;
  string local_568;
  allocator local_541;
  string local_540;
  allocator local_519;
  string local_518;
  allocator local_4f1;
  string local_4f0;
  ScriptBuilder local_4d0;
  allocator local_4a9;
  string local_4a8 [8];
  string expect_asm;
  string local_480 [8];
  string expect_hex;
  Message local_458;
  string local_450;
  undefined1 local_430 [8];
  AssertionResult gtest_ar_3;
  Message local_418;
  string local_410;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar_2;
  Message local_3d8;
  Script local_3d0;
  allocator local_391;
  string local_390;
  allocator local_369;
  string local_368;
  allocator local_341;
  string local_340;
  allocator local_319;
  string local_318;
  allocator local_2f1;
  string local_2f0;
  allocator local_2c9;
  string local_2c8;
  allocator local_2a1;
  string local_2a0;
  allocator local_279;
  string local_278;
  allocator local_251;
  string local_250;
  allocator local_229;
  string local_228;
  ScriptBuilder local_208;
  AssertHelper local_1e8;
  Message local_1e0;
  string local_1d8;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_1;
  Message local_1a0;
  string local_198;
  undefined1 local_178 [8];
  AssertionResult gtest_ar;
  Message local_160 [2];
  Script local_150;
  allocator local_111;
  string local_110;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  allocator local_99;
  string local_98;
  undefined1 local_68 [8];
  ScriptBuilder sb;
  Script script;
  ScriptBuilder_StringBuildTest_Test *this_local;
  
  cfd::core::Script::Script
            ((Script *)
             &sb.script_byte_array_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ScriptBuilder::ScriptBuilder((ScriptBuilder *)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"5",&local_99);
  cfd::core::ScriptBuilder::AppendString((ScriptBuilder *)local_68,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"2",&local_c1);
  cfd::core::ScriptBuilder::AppendString((ScriptBuilder *)local_68,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,"OP_ADD",&local_e9);
  cfd::core::ScriptBuilder::AppendString((ScriptBuilder *)local_68,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_110,"OP_CHECKSIG",&local_111);
  cfd::core::ScriptBuilder::AppendString((ScriptBuilder *)local_68,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ScriptBuilder::Build(&local_150,(ScriptBuilder *)local_68);
      cfd::core::Script::operator=
                ((Script *)
                 &sb.script_byte_array_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_150);
      cfd::core::Script::~Script(&local_150);
    }
  }
  else {
    testing::Message::Message(local_160);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0xe3,
               "Expected: script = sb.Build() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(local_160);
  }
  cfd::core::Script::GetHex_abi_cxx11_
            (&local_198,
             (Script *)
             &sb.script_byte_array_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_178,"script.GetHex().c_str()","\"555293ac\"",pcVar2,"555293ac");
  std::__cxx11::string::~string((string *)&local_198);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0xe4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
  cfd::core::Script::ToString_abi_cxx11_
            (&local_1d8,
             (Script *)
             &sb.script_byte_array_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1b8,"script.ToString().c_str()","\"5 2 OP_ADD OP_CHECKSIG\"",pcVar2,
             "5 2 OP_ADD OP_CHECKSIG");
  std::__cxx11::string::~string((string *)&local_1d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0xe5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  cfd::core::ScriptBuilder::ScriptBuilder(&local_208);
  cfd::core::ScriptBuilder::operator=((ScriptBuilder *)local_68,&local_208);
  cfd::core::ScriptBuilder::~ScriptBuilder(&local_208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_228,"0",&local_229);
  cfd::core::ScriptBuilder::AppendString((ScriptBuilder *)local_68,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_250,"17",&local_251);
  cfd::core::ScriptBuilder::AppendString((ScriptBuilder *)local_68,&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_278,"8738",&local_279);
  cfd::core::ScriptBuilder::AppendString((ScriptBuilder *)local_68,&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a0,"3355443",&local_2a1);
  cfd::core::ScriptBuilder::AppendString((ScriptBuilder *)local_68,&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c8,"17476",&local_2c9);
  cfd::core::ScriptBuilder::AppendString((ScriptBuilder *)local_68,&local_2c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2f0,"85",&local_2f1);
  cfd::core::ScriptBuilder::AppendString((ScriptBuilder *)local_68,&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_318,"26214",&local_319);
  cfd::core::ScriptBuilder::AppendString((ScriptBuilder *)local_68,&local_318);
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator((allocator<char> *)&local_319);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_340,"7829367",&local_341);
  cfd::core::ScriptBuilder::AppendString((ScriptBuilder *)local_68,&local_340);
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_368,"-2184",&local_369);
  cfd::core::ScriptBuilder::AppendString((ScriptBuilder *)local_68,&local_368);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_390,"-25",&local_391);
  cfd::core::ScriptBuilder::AppendString((ScriptBuilder *)local_68,&local_390);
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ScriptBuilder::Build(&local_3d0,(ScriptBuilder *)local_68);
      cfd::core::Script::operator=
                ((Script *)
                 &sb.script_byte_array_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_3d0);
      cfd::core::Script::~Script(&local_3d0);
    }
  }
  else {
    testing::Message::Message(&local_3d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0xf3,
               "Expected: script = sb.Build() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_3d8);
  }
  cfd::core::Script::GetHex_abi_cxx11_
            (&local_410,
             (Script *)
             &sb.script_byte_array_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_3f0,"script.GetHex().c_str()",
             "\"000111022222033333330244440155026666037777770288880199\"",pcVar2,
             "000111022222033333330244440155026666037777770288880199");
  std::__cxx11::string::~string((string *)&local_410);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
  if (!bVar1) {
    testing::Message::Message(&local_418);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0xf5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_418);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_418);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
  cfd::core::Script::ToString_abi_cxx11_
            (&local_450,
             (Script *)
             &sb.script_byte_array_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_430,"script.ToString().c_str()",
             "\"0 17 8738 3355443 17476 85 26214 7829367 -2184 -25\"",pcVar2,
             "0 17 8738 3355443 17476 85 26214 7829367 -2184 -25");
  std::__cxx11::string::~string((string *)&local_450);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_430);
  if (!bVar1) {
    testing::Message::Message(&local_458);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_430);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&expect_hex.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0xf7,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&expect_hex.field_2 + 8),&local_458);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&expect_hex.field_2 + 8));
    testing::Message::~Message(&local_458);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_430);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_480,
             "46304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e41042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0029000b1750455529357a820f6116d61351c05df34e116f1cc63fcacbd4f1a3882d2f629e7a0986ac03005c488ac"
             ,(allocator *)(expect_asm.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(expect_asm.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_4a8,
             "304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e 042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0 144 OP_CHECKLOCKTIMEVERIFY OP_DROP 1469272661 OP_SHA256 f6116d61351c05df34e116f1cc63fcacbd4f1a3882d2f629e7a0986ac03005c4 OP_EQUALVERIFY OP_CHECKSIG"
             ,&local_4a9);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
  cfd::core::ScriptBuilder::ScriptBuilder(&local_4d0);
  cfd::core::ScriptBuilder::operator=((ScriptBuilder *)local_68,&local_4d0);
  cfd::core::ScriptBuilder::~ScriptBuilder(&local_4d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_4f0,
             "304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e"
             ,&local_4f1);
  cfd::core::ScriptBuilder::AppendString((ScriptBuilder *)local_68,&local_4f0);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_518,
             "042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0"
             ,&local_519);
  cfd::core::ScriptBuilder::AppendString((ScriptBuilder *)local_68,&local_518);
  std::__cxx11::string::~string((string *)&local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_540,"144",&local_541);
  cfd::core::ScriptBuilder::AppendString((ScriptBuilder *)local_68,&local_540);
  std::__cxx11::string::~string((string *)&local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_568,"OP_CHECKLOCKTIMEVERIFY",&local_569);
  cfd::core::ScriptBuilder::AppendString((ScriptBuilder *)local_68,&local_568);
  std::__cxx11::string::~string((string *)&local_568);
  std::allocator<char>::~allocator((allocator<char> *)&local_569);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_590,"OP_DROP",&local_591);
  cfd::core::ScriptBuilder::AppendString((ScriptBuilder *)local_68,&local_590);
  std::__cxx11::string::~string((string *)&local_590);
  std::allocator<char>::~allocator((allocator<char> *)&local_591);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5b8,"1469272661",&local_5b9);
  cfd::core::ScriptBuilder::AppendString((ScriptBuilder *)local_68,&local_5b8);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5e0,"OP_SHA256",&local_5e1);
  cfd::core::ScriptBuilder::AppendString((ScriptBuilder *)local_68,&local_5e0);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_608,"f6116d61351c05df34e116f1cc63fcacbd4f1a3882d2f629e7a0986ac03005c4"
             ,&local_609);
  cfd::core::ScriptBuilder::AppendString((ScriptBuilder *)local_68,&local_608);
  std::__cxx11::string::~string((string *)&local_608);
  std::allocator<char>::~allocator((allocator<char> *)&local_609);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_630,"OP_EQUALVERIFY",&local_631);
  cfd::core::ScriptBuilder::AppendString((ScriptBuilder *)local_68,&local_630);
  std::__cxx11::string::~string((string *)&local_630);
  std::allocator<char>::~allocator((allocator<char> *)&local_631);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_658,"OP_CHECKSIG",&local_659);
  cfd::core::ScriptBuilder::AppendString((ScriptBuilder *)local_68,&local_658);
  std::__cxx11::string::~string((string *)&local_658);
  std::allocator<char>::~allocator((allocator<char> *)&local_659);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ScriptBuilder::Build(&local_698,(ScriptBuilder *)local_68);
      cfd::core::Script::operator=
                ((Script *)
                 &sb.script_byte_array_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_698);
      cfd::core::Script::~Script(&local_698);
    }
  }
  else {
    testing::Message::Message(&local_6a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0x109,
               "Expected: script = sb.Build() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_6a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_6a0);
  }
  cfd::core::Script::GetHex_abi_cxx11_
            (&local_6d8,
             (Script *)
             &sb.script_byte_array_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_6b8,"script.GetHex().c_str()","expect_hex.c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_6d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b8);
  if (!bVar1) {
    testing::Message::Message(&local_6e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0x10a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_6e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_6e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b8);
  cfd::core::Script::ToString_abi_cxx11_
            (&local_718,
             (Script *)
             &sb.script_byte_array_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_6f8,"script.ToString().c_str()","expect_asm.c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_718);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6f8);
  if (!bVar1) {
    testing::Message::Message(&local_720);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_728,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0x10b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_728,&local_720);
    testing::internal::AssertHelper::~AssertHelper(&local_728);
    testing::Message::~Message(&local_720);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6f8);
  cfd::core::ScriptBuilder::ScriptBuilder(&local_748);
  cfd::core::ScriptBuilder::operator=((ScriptBuilder *)local_68,&local_748);
  cfd::core::ScriptBuilder::~ScriptBuilder(&local_748);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_768,"0x00",&local_769);
  cfd::core::ScriptBuilder::AppendString((ScriptBuilder *)local_68,&local_768);
  std::__cxx11::string::~string((string *)&local_768);
  std::allocator<char>::~allocator((allocator<char> *)&local_769);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_790,"0x11",&local_791);
  cfd::core::ScriptBuilder::AppendString((ScriptBuilder *)local_68,&local_790);
  std::__cxx11::string::~string((string *)&local_790);
  std::allocator<char>::~allocator((allocator<char> *)&local_791);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7b8,"0x2222",&local_7b9);
  cfd::core::ScriptBuilder::AppendString((ScriptBuilder *)local_68,&local_7b8);
  std::__cxx11::string::~string((string *)&local_7b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_7e0,"0x333333",&local_7e1);
  cfd::core::ScriptBuilder::AppendString((ScriptBuilder *)local_68,&local_7e0);
  std::__cxx11::string::~string((string *)&local_7e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7e1);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ScriptBuilder::Build(&local_820,(ScriptBuilder *)local_68);
      cfd::core::Script::operator=
                ((Script *)
                 &sb.script_byte_array_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_820);
      cfd::core::Script::~Script(&local_820);
    }
  }
  else {
    testing::Message::Message(&local_828);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0x114,
               "Expected: script = sb.Build() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_828);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_828);
  }
  cfd::core::Script::GetHex_abi_cxx11_
            (&local_860,
             (Script *)
             &sb.script_byte_array_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_840,"script.GetHex().c_str()","\"0100011102222203333333\"",pcVar2,
             "0100011102222203333333");
  std::__cxx11::string::~string((string *)&local_860);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_840);
  if (!bVar1) {
    testing::Message::Message(&local_868);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_840);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0x116,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_868);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_868);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_840);
  cfd::core::Script::ToString_abi_cxx11_
            (&local_8a0,
             (Script *)
             &sb.script_byte_array_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_880,"script.ToString().c_str()","\"0 17 8738 3355443\"",pcVar2,
             "0 17 8738 3355443");
  std::__cxx11::string::~string((string *)&local_8a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_880);
  if (!bVar1) {
    testing::Message::Message(&local_8a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_880);
    testing::internal::AssertHelper::AssertHelper
              (&local_8b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0x118,pcVar2);
    testing::internal::AssertHelper::operator=(&local_8b0,&local_8a8);
    testing::internal::AssertHelper::~AssertHelper(&local_8b0);
    testing::Message::~Message(&local_8a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_880);
  std::__cxx11::string::~string(local_4a8);
  std::__cxx11::string::~string(local_480);
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)local_68);
  cfd::core::Script::~Script
            ((Script *)
             &sb.script_byte_array_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(ScriptBuilder, StringBuildTest) {
  Script script;
  ScriptBuilder sb = ScriptBuilder();
  sb.AppendString("5");
  sb.AppendString("2");
  sb.AppendString("OP_ADD");
  sb.AppendString("OP_CHECKSIG");

  EXPECT_NO_THROW(script = sb.Build());
  EXPECT_STREQ(script.GetHex().c_str(), "555293ac");
  EXPECT_STREQ(script.ToString().c_str(), "5 2 OP_ADD OP_CHECKSIG");

  sb = ScriptBuilder();
  sb.AppendString("0");
  sb.AppendString("17");
  sb.AppendString("8738");
  sb.AppendString("3355443");
  sb.AppendString("17476");
  sb.AppendString("85");
  sb.AppendString("26214");
  sb.AppendString("7829367");
  sb.AppendString("-2184");
  sb.AppendString("-25");

  EXPECT_NO_THROW(script = sb.Build());
  EXPECT_STREQ(script.GetHex().c_str(),
    "000111022222033333330244440155026666037777770288880199");
  EXPECT_STREQ(script.ToString().c_str(),
    "0 17 8738 3355443 17476 85 26214 7829367 -2184 -25");

  std::string expect_hex =
  "46304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e41042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0029000b1750455529357a820f6116d61351c05df34e116f1cc63fcacbd4f1a3882d2f629e7a0986ac03005c488ac";// NOLINT
  std::string expect_asm =
  "304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e 042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0 144 OP_CHECKLOCKTIMEVERIFY OP_DROP 1469272661 OP_SHA256 f6116d61351c05df34e116f1cc63fcacbd4f1a3882d2f629e7a0986ac03005c4 OP_EQUALVERIFY OP_CHECKSIG";// NOLINT
  sb = ScriptBuilder();
  sb.AppendString("304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e");
  sb.AppendString("042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0");
  sb.AppendString("144");
  sb.AppendString("OP_CHECKLOCKTIMEVERIFY");
  sb.AppendString("OP_DROP");
  sb.AppendString("1469272661");
  sb.AppendString("OP_SHA256");
  sb.AppendString("f6116d61351c05df34e116f1cc63fcacbd4f1a3882d2f629e7a0986ac03005c4");
  sb.AppendString("OP_EQUALVERIFY");
  sb.AppendString("OP_CHECKSIG");

  EXPECT_NO_THROW(script = sb.Build());
  EXPECT_STREQ(script.GetHex().c_str(), expect_hex.c_str());
  EXPECT_STREQ(script.ToString().c_str(), expect_asm.c_str());

  // hex test
  sb = ScriptBuilder();
  sb.AppendString("0x00");
  sb.AppendString("0x11");
  sb.AppendString("0x2222");
  sb.AppendString("0x333333");

  EXPECT_NO_THROW(script = sb.Build());
  EXPECT_STREQ(script.GetHex().c_str(),
    "0100011102222203333333");
  EXPECT_STREQ(script.ToString().c_str(),
    "0 17 8738 3355443");
}